

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeat_end_matcher.hpp
# Opt level: O1

bool __thiscall
boost::xpressive::detail::repeat_end_matcher<mpl_::bool_<false>>::
match_<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
          (repeat_end_matcher<mpl_::bool_<false>> *this,long state,long *next)

{
  int iVar1;
  long lVar2;
  char cVar3;
  uint *puVar4;
  
  iVar1 = *(int *)this;
  lVar2 = *(long *)(state + 8);
  if ((*(uint *)(this + 4) <= *(uint *)(lVar2 + 0x14 + (long)iVar1 * 0x28)) &&
     (cVar3 = (**(code **)(*next + 0x10))(next,state), cVar3 != '\0')) {
    return true;
  }
  puVar4 = (uint *)(lVar2 + (long)iVar1 * 0x28 + 0x14);
  if (*puVar4 < *(uint *)(this + 8)) {
    *puVar4 = *puVar4 + 1;
    cVar3 = (**(code **)(**(long **)(this + 0x10) + 0x10))(*(long **)(this + 0x10),state);
    if (cVar3 != '\0') {
      return true;
    }
    *puVar4 = *puVar4 - 1;
  }
  return false;
}

Assistant:

bool match_(match_state<BidiIter> &state, Next const &next, mpl::false_) const
        {
            sub_match_impl<BidiIter> &br = state.sub_match(this->mark_number_);

            if(this->min_ <= br.repeat_count_)
            {
                if(next.skip_match(state))
                {
                    return true;
                }
            }

            if(this->max_ > br.repeat_count_)
            {
                ++br.repeat_count_;
                if(next.top_match(state, this->back_))
                {
                    return true;
                }
                --br.repeat_count_;
            }

            return false;
        }